

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O3

void __thiscall HEkkDualRow::chooseJoinpack(HEkkDualRow *this,HEkkDualRow *otherRow)

{
  int iVar1;
  int iVar2;
  pointer ppVar3;
  pointer ppVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  
  iVar1 = otherRow->workCount;
  iVar2 = this->workCount;
  if (0 < (long)iVar1) {
    ppVar3 = (this->workData).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVar4 = (otherRow->workData).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)iVar1 + 1;
    lVar6 = 0;
    do {
      *(undefined4 *)((long)&ppVar3[iVar2].first + lVar6) =
           *(undefined4 *)((long)&ppVar4->first + lVar6);
      *(undefined8 *)((long)&ppVar3[iVar2].second + lVar6) =
           *(undefined8 *)((long)&ppVar4->second + lVar6);
      uVar5 = uVar5 - 1;
      lVar6 = lVar6 + 0x10;
    } while (1 < uVar5);
  }
  this->workCount = iVar2 + iVar1;
  dVar7 = otherRow->workTheta;
  if (this->workTheta <= otherRow->workTheta) {
    dVar7 = this->workTheta;
  }
  this->workTheta = dVar7;
  return;
}

Assistant:

void HEkkDualRow::chooseJoinpack(const HEkkDualRow* otherRow) {
  /**
   * Join pack of possible candidates in this row with possible
   * candidates in otherRow
   */
  const HighsInt otherCount = otherRow->workCount;
  const pair<HighsInt, double>* otherData = otherRow->workData.data();
  copy(otherData, otherData + otherCount, &workData[workCount]);
  workCount = workCount + otherCount;
  workTheta = min(workTheta, otherRow->workTheta);
}